

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O2

bool __thiscall optimization::loop_expand::loop_info::operator<(loop_info *this,loop_info *other)

{
  ostream *poVar1;
  Function *pFVar2;
  char *tag;
  Tag *tag_00;
  bool bVar3;
  allocator<char> local_fb;
  allocator<char> local_fa;
  ostream local_f9;
  string local_f8;
  undefined1 local_d8 [80];
  undefined **local_88;
  undefined8 local_80;
  undefined1 local_78;
  Function local_70;
  
  switch(this->in_op) {
  case Gt:
    bVar3 = other->in_value < (this->init_var).second;
    break;
  case Lt:
    bVar3 = (this->init_var).second < other->in_value;
    break;
  case Gte:
    bVar3 = other->in_value <= (this->init_var).second;
    break;
  case Lte:
    bVar3 = (this->init_var).second <= other->in_value;
    break;
  case Eq:
    bVar3 = (this->init_var).second == other->in_value;
    break;
  case Neq:
    bVar3 = (this->init_var).second != other->in_value;
    break;
  default:
    local_f9 = (ostream)0x5;
    AixLog::operator<<(&local_f9,(Severity *)other);
    AixLog::Tag::Tag((Tag *)(local_d8 + 0x20));
    AixLog::operator<<((ostream *)(local_d8 + 0x20),(Tag *)other);
    local_80 = std::chrono::_V2::system_clock::now();
    local_88 = &PTR__Timestamp_001d8f28;
    local_78 = 0;
    AixLog::operator<<((ostream *)&local_88,(Timestamp *)other);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"operator<",&local_fa);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,&local_fb);
    pFVar2 = (Function *)local_d8;
    AixLog::Function::Function(&local_70,(string *)pFVar2,&local_f8,0x86);
    AixLog::operator<<((ostream *)&local_70,pFVar2);
    tag = "ERROR ! Unrecognized in_op";
    std::operator<<((ostream *)&std::clog,"ERROR ! Unrecognized in_op");
    AixLog::Function::~Function(&local_70);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)local_d8);
    AixLog::Tag::~Tag((Tag *)(local_d8 + 0x20));
    local_f9 = (ostream)0x5;
    AixLog::operator<<(&local_f9,(Severity *)tag);
    AixLog::Tag::Tag((Tag *)(local_d8 + 0x20));
    AixLog::operator<<((ostream *)(local_d8 + 0x20),(Tag *)tag);
    local_80 = std::chrono::_V2::system_clock::now();
    local_88 = &PTR__Timestamp_001d8f28;
    local_78 = 0;
    AixLog::operator<<((ostream *)&local_88,(Timestamp *)tag);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"operator<",&local_fa);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,&local_fb);
    pFVar2 = (Function *)local_d8;
    AixLog::Function::Function(&local_70,(string *)pFVar2,&local_f8,0x87);
    AixLog::operator<<((ostream *)&local_70,pFVar2);
    tag_00 = (Tag *)(ulong)this->in_op;
    mir::inst::display_op((ostream *)&std::clog,this->in_op);
    AixLog::Function::~Function(&local_70);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)local_d8);
    AixLog::Tag::~Tag((Tag *)(local_d8 + 0x20));
    local_f9 = (ostream)0x5;
    AixLog::operator<<(&local_f9,(Severity *)tag_00);
    AixLog::Tag::Tag((Tag *)(local_d8 + 0x20));
    AixLog::operator<<((ostream *)(local_d8 + 0x20),tag_00);
    local_80 = std::chrono::_V2::system_clock::now();
    local_88 = &PTR__Timestamp_001d8f28;
    local_78 = 0;
    AixLog::operator<<((ostream *)&local_88,(Timestamp *)tag_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"operator<",&local_fa);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
               ,&local_fb);
    pFVar2 = (Function *)local_d8;
    AixLog::Function::Function(&local_70,(string *)pFVar2,&local_f8,0x88);
    AixLog::operator<<((ostream *)&local_70,pFVar2);
    poVar1 = std::operator<<((ostream *)&std::clog," ! ");
    std::endl<char,std::char_traits<char>>(poVar1);
    AixLog::Function::~Function(&local_70);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)local_d8);
    AixLog::Tag::~Tag((Tag *)(local_d8 + 0x20));
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator<(const loop_info& other) const {
    switch (in_op) {
      case mir::inst::Op::Eq:
        return init_var.second == other.in_value;
      case mir::inst::Op::Neq:
        return init_var.second != other.in_value;
      case mir::inst::Op::Lt:
        return init_var.second < other.in_value;
      case mir::inst::Op::Lte:
        return init_var.second <= other.in_value;
      case mir::inst::Op::Gt:
        return init_var.second > other.in_value;
      case mir::inst::Op::Gte:
        return init_var.second >= other.in_value;
      default: {
        LOG(ERROR) << "ERROR ! Unrecognized in_op";
        mir::inst::display_op(LOG(ERROR), in_op);
        LOG(ERROR) << " ! " << std::endl;
        return false;
      }
    }
  }